

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# FastEntityStatePdu.cpp
# Opt level: O0

int __thiscall DIS::FastEntityStatePdu::getMarshalledSize(FastEntityStatePdu *this)

{
  undefined8 uVar1;
  int iVar2;
  size_type sVar3;
  const_reference pvVar4;
  undefined1 local_40 [8];
  VariableParameter listElement;
  unsigned_long_long idx;
  int marshalSize;
  FastEntityStatePdu *this_local;
  
  iVar2 = EntityInformationFamilyPdu::getMarshalledSize(&this->super_EntityInformationFamilyPdu);
  idx._4_4_ = iVar2 + 0x84;
  listElement._variableParameterFields2 = 0;
  listElement._variableParameterFields3 = 0;
  listElement._variableParameterFields4 = '\0';
  listElement._31_1_ = 0;
  while( true ) {
    uVar1 = listElement._24_8_;
    sVar3 = std::vector<DIS::VariableParameter,_std::allocator<DIS::VariableParameter>_>::size
                      (&this->_variableParameters);
    if (sVar3 <= (ulong)uVar1) break;
    pvVar4 = std::vector<DIS::VariableParameter,_std::allocator<DIS::VariableParameter>_>::
             operator[](&this->_variableParameters,listElement._24_8_);
    VariableParameter::VariableParameter((VariableParameter *)local_40,pvVar4);
    iVar2 = VariableParameter::getMarshalledSize((VariableParameter *)local_40);
    idx._4_4_ = idx._4_4_ + iVar2;
    VariableParameter::~VariableParameter((VariableParameter *)local_40);
    listElement._24_8_ = listElement._24_8_ + 1;
  }
  return idx._4_4_;
}

Assistant:

int FastEntityStatePdu::getMarshalledSize() const
{
   int marshalSize = 0;

   marshalSize = EntityInformationFamilyPdu::getMarshalledSize();
   marshalSize = marshalSize + 2;  // _site
   marshalSize = marshalSize + 2;  // _application
   marshalSize = marshalSize + 2;  // _entity
   marshalSize = marshalSize + 1;  // _forceId
   marshalSize = marshalSize + 1;  // _numberOfVariableParameters
   marshalSize = marshalSize + 1;  // _entityKind
   marshalSize = marshalSize + 1;  // _domain
   marshalSize = marshalSize + 2;  // _country
   marshalSize = marshalSize + 1;  // _category
   marshalSize = marshalSize + 1;  // _subcategory
   marshalSize = marshalSize + 1;  // _specific
   marshalSize = marshalSize + 1;  // _extra
   marshalSize = marshalSize + 1;  // _altEntityKind
   marshalSize = marshalSize + 1;  // _altDomain
   marshalSize = marshalSize + 2;  // _altCountry
   marshalSize = marshalSize + 1;  // _altCategory
   marshalSize = marshalSize + 1;  // _altSubcategory
   marshalSize = marshalSize + 1;  // _altSpecific
   marshalSize = marshalSize + 1;  // _altExtra
   marshalSize = marshalSize + 4;  // _xVelocity
   marshalSize = marshalSize + 4;  // _yVelocity
   marshalSize = marshalSize + 4;  // _zVelocity
   marshalSize = marshalSize + 8;  // _xLocation
   marshalSize = marshalSize + 8;  // _yLocation
   marshalSize = marshalSize + 8;  // _zLocation
   marshalSize = marshalSize + 4;  // _psi
   marshalSize = marshalSize + 4;  // _theta
   marshalSize = marshalSize + 4;  // _phi
   marshalSize = marshalSize + 4;  // _entityAppearance
   marshalSize = marshalSize + 1;  // _deadReckoningAlgorithm
   marshalSize = marshalSize + 15 * 1;  // _otherParameters
   marshalSize = marshalSize + 4;  // _xAcceleration
   marshalSize = marshalSize + 4;  // _yAcceleration
   marshalSize = marshalSize + 4;  // _zAcceleration
   marshalSize = marshalSize + 4;  // _xAngularVelocity
   marshalSize = marshalSize + 4;  // _yAngularVelocity
   marshalSize = marshalSize + 4;  // _zAngularVelocity
   marshalSize = marshalSize + 12 * 1;  // _marking
   marshalSize = marshalSize + 4;  // _capabilities

   for(unsigned long long idx=0; idx < _variableParameters.size(); idx++)
   {
        VariableParameter listElement = _variableParameters[idx];
        marshalSize = marshalSize + listElement.getMarshalledSize();
    }

    return marshalSize;
}